

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<double,int,long_double>
                 (size_t col_num,size_t nrows,double *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int ix_1;
  long lVar4;
  int ix;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble local_e4;
  longdouble local_d8;
  longdouble local_cc;
  ulong local_88;
  double local_80;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  iVar1 = Xc_indptr[col_num];
  lVar4 = (long)iVar1;
  iVar2 = Xc_indptr[col_num + 1];
  local_80 = -INFINITY;
  if (1 < nrows && iVar2 != iVar1) {
    local_88 = nrows;
    if (missing_action == Fail) {
      lVar9 = (longdouble)0;
      local_e4 = lVar9;
      local_d8 = lVar9;
      local_cc = lVar9;
      for (; lVar6 = in_ST1, lVar5 = in_ST0, lVar4 < iVar2; lVar4 = lVar4 + 1) {
        local_d8 = local_d8 + (longdouble)Xc[lVar4];
        lVar9 = in_ST2;
        in_ST2 = in_ST4;
        lVar7 = in_ST4;
        lVar8 = in_ST4;
        fmal();
        fmal();
        fmal();
        in_ST0 = in_ST3;
        in_ST1 = in_ST4;
        in_ST3 = lVar7;
        in_ST4 = lVar8;
        local_e4 = lVar5;
        local_cc = lVar6;
      }
    }
    else {
      local_d8 = (longdouble)0;
      local_e4 = local_d8;
      lVar9 = local_d8;
      local_cc = local_d8;
      for (; lVar4 < iVar2; lVar4 = lVar4 + 1) {
        lVar5 = (longdouble)Xc[lVar4];
        local_68 = SUB108(lVar5,0);
        uStack_60 = (ushort)((unkuint10)lVar5 >> 0x40);
        if ((NAN(Xc[lVar4])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000)) {
          local_88 = local_88 - 1;
          lVar5 = in_ST1;
        }
        else {
          local_d8 = local_d8 + lVar5;
          lVar6 = in_ST2;
          lVar5 = in_ST2;
          lVar7 = in_ST2;
          fmal();
          fmal();
          fmal();
          local_e4 = in_ST0;
          lVar9 = in_ST2;
          in_ST0 = lVar6;
          in_ST2 = lVar7;
          local_cc = in_ST1;
        }
        in_ST1 = lVar5;
      }
      if (local_88 <= nrows - (long)(iVar2 - iVar1)) {
        return -INFINITY;
      }
    }
    if (1 < local_88) {
      if ((local_e4 != (longdouble)0) || (NAN(local_e4) || NAN((longdouble)0))) {
        if ((local_e4 != local_d8 * local_d8) || (NAN(local_e4) || NAN(local_d8 * local_d8))) {
          lVar5 = (longdouble)(long)local_88 +
                  (longdouble)(float)(&DAT_003250d8)[(long)local_88 < 0];
          lVar6 = local_d8 / lVar5;
          lVar7 = lVar6 * lVar6;
          lVar8 = local_e4 / lVar5 - lVar7;
          if ((!NAN(lVar8)) &&
             (((longdouble)2.220446e-16 < lVar8 ||
              (bVar3 = check_more_than_two_unique_values<double,int>
                                 (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar3)))) {
            if (lVar8 <= (longdouble)0) {
              local_80 = 0.0;
            }
            else {
              lVar9 = (lVar6 * lVar7 * lVar6 * lVar5 +
                      local_d8 * (longdouble)-4.0 * lVar7 * lVar6 +
                      local_e4 * (longdouble)6.0 * lVar7 +
                      local_cc * (longdouble)-4.0 * lVar6 + lVar9) / (lVar8 * lVar8 * lVar5);
              uStack_70 = (ushort)((unkuint10)lVar9 >> 0x40);
              local_78 = SUB108(lVar9,0);
              if ((((unkuint10)lVar9 & 0x7fff) == 0 ||
                   (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) &&
                 (local_80 = (double)lVar9, local_80 <= 0.0)) {
                local_80 = 0.0;
              }
            }
          }
        }
      }
    }
  }
  return local_80;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}